

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

void xm_create_context_from_libxmize(xm_context_t **ctxp,char *libxmized,uint32_t rate)

{
  xm_instrument_t **ppxVar1;
  uint8_t **ppuVar2;
  xm_channel_context_t **ppxVar3;
  long *plVar4;
  char *pcVar5;
  short *psVar6;
  anon_union_8_2_8127e1e2_for_xm_sample_s_11 *paVar7;
  xm_sample_t **ppxVar8;
  uint uVar9;
  int8_t *piVar10;
  xm_context_t *pxVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  xm_instrument_t *pxVar15;
  size_t k_1;
  xm_sample_t *pxVar16;
  size_t k;
  ulong uVar17;
  
  *ctxp = (xm_context_t *)libxmized;
  *(char **)(libxmized + 0x118) = libxmized + *(long *)(libxmized + 0x118);
  ppxVar1 = &((*ctxp)->module).instruments;
  *ppxVar1 = (xm_instrument_t *)
             (((*ctxp)->module).pattern_table + (long)((*ppxVar1)->sample_of_notes + -10) + -0x10);
  ppuVar2 = &(*ctxp)->row_loop_count;
  *ppuVar2 = *ppuVar2 + (long)*ctxp;
  ppxVar3 = &(*ctxp)->channels;
  *ppxVar3 = (xm_channel_context_t *)
             (((*ctxp)->module).pattern_table + (long)((*ppxVar3)[-1].actual_volume + -4));
  pxVar11 = *ctxp;
  if ((pxVar11->module).num_patterns != 0) {
    lVar12 = 8;
    uVar13 = 0;
    do {
      plVar4 = (long *)((long)&((pxVar11->module).patterns)->num_rows + lVar12);
      *plVar4 = (long)((pxVar11->module).pattern_table + *plVar4 + -0x18);
      uVar13 = uVar13 + 1;
      pxVar11 = *ctxp;
      lVar12 = lVar12 + 0x10;
    } while (uVar13 < (pxVar11->module).num_patterns);
  }
  if ((pxVar11->module).num_instruments != 0) {
    uVar13 = 0;
    do {
      ppxVar8 = &(pxVar11->module).instruments[uVar13].samples;
      *ppxVar8 = (xm_sample_t *)((pxVar11->module).pattern_table + (long)&(*ppxVar8)[-1].panning);
      pxVar11 = *ctxp;
      pxVar15 = (pxVar11->module).instruments;
      if (pxVar15[uVar13].num_samples != 0) {
        uVar14 = 0;
        do {
          paVar7 = &pxVar15[uVar13].samples[uVar14].field_11;
          paVar7->data8 = paVar7->data8 + (long)pxVar11;
          pxVar11 = *ctxp;
          pxVar15 = (pxVar11->module).instruments;
          pxVar16 = pxVar15[uVar13].samples;
          uVar9 = pxVar16[uVar14].length;
          if (1 < (ulong)uVar9) {
            if (pxVar16[uVar14].bits == '\b') {
              uVar17 = 1;
              do {
                pcVar5 = pxVar16[uVar14].field_11.data8 + uVar17;
                *pcVar5 = *pcVar5 + pxVar16[uVar14].field_11.data8[uVar17 - 1];
                uVar17 = uVar17 + 1;
                pxVar11 = *ctxp;
                pxVar15 = (pxVar11->module).instruments;
                pxVar16 = pxVar15[uVar13].samples;
              } while (uVar17 < pxVar16[uVar14].length);
            }
            else {
              uVar17 = 1;
              do {
                piVar10 = pxVar16[uVar14].field_11.data8;
                psVar6 = (short *)(piVar10 + uVar17 * 2);
                *psVar6 = *psVar6 + *(short *)(piVar10 + uVar17 * 2 + -2);
                uVar17 = uVar17 + 1;
              } while (uVar9 != uVar17);
            }
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < pxVar15[uVar13].num_samples);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (pxVar11->module).num_instruments);
  }
  return;
}

Assistant:

void xm_create_context_from_libxmize(xm_context_t** ctxp, char* libxmized, uint32_t rate) {
	size_t i, j;

	*ctxp = (void*)libxmized;

	/* Reverse steps of libxmize.c */
	OFFSET((*ctxp)->module.patterns);
	OFFSET((*ctxp)->module.instruments);
	OFFSET((*ctxp)->row_loop_count);
	OFFSET((*ctxp)->channels);

	for(i = 0; i < (*ctxp)->module.num_patterns; ++i) {
		OFFSET((*ctxp)->module.patterns[i].slots);
	}

	for(i = 0; i < (*ctxp)->module.num_instruments; ++i) {
		OFFSET((*ctxp)->module.instruments[i].samples);

		for(j = 0; j < (*ctxp)->module.instruments[i].num_samples; ++j) {
			OFFSET((*ctxp)->module.instruments[i].samples[j].data8);

			if(XM_LIBXMIZE_DELTA_SAMPLES) {
				if((*ctxp)->module.instruments[i].samples[j].length > 1) {
					if((*ctxp)->module.instruments[i].samples[j].bits == 8) {
						for(size_t k = 1; k < (*ctxp)->module.instruments[i].samples[j].length; ++k) {
							(*ctxp)->module.instruments[i].samples[j].data8[k] += (*ctxp)->module.instruments[i].samples[j].data8[k-1];
						}
					} else {
						for(size_t k = 1; k < (*ctxp)->module.instruments[i].samples[j].length; ++k) {
							(*ctxp)->module.instruments[i].samples[j].data16[k] += (*ctxp)->module.instruments[i].samples[j].data16[k-1];
						}
					}
				}
			}
		}
	}
}